

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

void __thiscall
capnp::compiler::ModuleLoader::ModuleLoader(ModuleLoader *this,GlobalErrorReporter *errorReporter)

{
  Impl *this_00;
  
  this_00 = (Impl *)operator_new(0x68);
  Impl::Impl(this_00,errorReporter);
  (this->impl).disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::compiler::ModuleLoader::Impl>::instance;
  (this->impl).ptr = this_00;
  return;
}

Assistant:

ModuleLoader::ModuleLoader(GlobalErrorReporter& errorReporter)
    : impl(kj::heap<Impl>(errorReporter)) {}